

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall
cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName,TargetType targetType)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchDirs;
  string tmpOutputFile;
  ostringstream emsg;
  allocator<char> local_249;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_210;
  string *local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  (this->FindErrorMessage)._M_string_length = 0;
  *(this->FindErrorMessage)._M_dataplus._M_p = '\0';
  (this->OutputFile)._M_string_length = 0;
  *(this->OutputFile)._M_dataplus._M_p = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"/",(allocator<char> *)&local_1a8);
  if (targetType == EXECUTABLE) {
    std::__cxx11::string::append((string *)&local_210);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"CMAKE_EXECUTABLE_SUFFIX",(allocator<char> *)&local_248);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_210);
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"CMAKE_STATIC_LIBRARY_PREFIX",(allocator<char> *)&local_248);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_210);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"CMAKE_STATIC_LIBRARY_SUFFIX",(allocator<char> *)&local_248);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_210);
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&local_228);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"CMAKE_TRY_COMPILE_CONFIGURATION",(allocator<char> *)&local_248);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"/",(allocator<char> *)&local_248);
    std::__cxx11::string::append((char *)&local_1a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[7]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             (char (*) [7])"/Debug");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             (char (*) [13])"/Development");
  pbVar2 = local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1f0 = (string *)&this->FindErrorMessage;
  pbVar6 = local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar6 == pbVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Unable to find the executable at any of:\n");
      std::operator+(&local_1c8,"  ",&this->BinaryDirectory);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"\n",&local_249);
      cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_248,&local_1c8,&local_228,&local_210,&local_1e8);
      poVar5 = std::operator<<(&local_1a8,(string *)&local_248);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=(local_1f0,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_002f0160:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
      std::__cxx11::string::~string((string *)&local_210);
      return;
    }
    std::__cxx11::string::string((string *)&local_1a8,(string *)&this->BinaryDirectory);
    std::__cxx11::string::append((string *)&local_1a8);
    std::__cxx11::string::append((string *)&local_1a8);
    bVar3 = cmsys::SystemTools::FileExists((string *)&local_1a8);
    if (bVar3) {
      cmsys::SystemTools::CollapseFullPath(&local_248,(string *)&local_1a8);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1a8);
      goto LAB_002f0160;
    }
    std::__cxx11::string::~string((string *)&local_1a8);
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName,
                                      cmStateEnums::TargetType targetType)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  if (targetType == cmStateEnums::EXECUTABLE) {
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_EXECUTABLE_SUFFIX");
  } else // if (targetType == cmStateEnums::STATIC_LIBRARY)
  {
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX");
    tmpOutputFile += targetName;
    tmpOutputFile +=
      this->Makefile->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX");
  }

  // a list of directories where to search for the compilation result
  // at first directly in the binary dir
  std::vector<std::string> searchDirs;
  searchDirs.emplace_back();

  const char* config =
    this->Makefile->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  // if a config was specified try that first
  if (config && config[0]) {
    std::string tmp = "/";
    tmp += config;
    searchDirs.push_back(std::move(tmp));
  }
  searchDirs.emplace_back("/Debug");
#if defined(__APPLE__)
  std::string app = "/Debug/" + targetName + ".app";
  searchDirs.push_back(std::move(app));
#endif
  searchDirs.emplace_back("/Development");

  for (std::string const& sdir : searchDirs) {
    std::string command = this->BinaryDirectory;
    command += sdir;
    command += tmpOutputFile;
    if (cmSystemTools::FileExists(command)) {
      this->OutputFile = cmSystemTools::CollapseFullPath(command);
      return;
    }
  }

  std::ostringstream emsg;
  emsg << "Unable to find the executable at any of:\n";
  emsg << cmWrap("  " + this->BinaryDirectory, searchDirs, tmpOutputFile, "\n")
       << "\n";
  this->FindErrorMessage = emsg.str();
}